

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_contains_all_different_sizes(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *bitset_00;
  undefined8 uVar2;
  
  bitset = bitset_create_with_capacity(10);
  bitset_00 = bitset_create_with_capacity(5);
  bitset_set(bitset,1);
  bitset_set(bitset,4);
  bitset_set(bitset,6);
  bitset_set(bitset_00,1);
  bitset_set(bitset_00,4);
  _Var1 = bitset_contains_all(bitset,bitset_00);
  if (_Var1) {
    _Var1 = bitset_contains_all(bitset_00,bitset);
    if (!_Var1) {
      bitset_free(bitset);
      bitset_free(bitset_00);
      return;
    }
    uVar2 = 0xe4;
  }
  else {
    uVar2 = 0xe3;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all_different_sizes",uVar2);
  exit(1);
}

Assistant:

void test_contains_all_different_sizes() {
  const size_t superset_size = 10;
  const size_t subset_size = 5;

  bitset_t *superset = bitset_create_with_capacity(superset_size);
  bitset_t *subset = bitset_create_with_capacity(subset_size);

  bitset_set(superset, 1);
  bitset_set(superset, subset_size - 1);
  bitset_set(superset, subset_size + 1);

  bitset_set(subset, 1);
  bitset_set(subset, subset_size - 1);

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}